

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

bool __thiscall
helics::ValueFederateManager::getUpdateFromCore(ValueFederateManager *this,Input *inp)

{
  void *pvVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  pvVar1 = inp->dataReference;
  pp_Var2 = this->coreObject->_vptr_Core;
  if (inp->inputVectorOp != NO_OP) {
    iVar4 = (*pp_Var2[0x33])();
    *(undefined1 *)((long)pvVar1 + 0xe0) = 0;
    bVar3 = Input::vectorDataProcess
                      (inp,(vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                            *)CONCAT44(extraout_var,iVar4));
    return bVar3;
  }
  iVar4 = (*pp_Var2[0x32])(this->coreObject,(ulong)(uint)(inp->super_Interface).handle.hid,0);
  std::__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             (__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(extraout_var_00,iVar4));
  data_view::operator=
            ((data_view *)((long)pvVar1 + 8),(shared_ptr<const_helics::SmallBuffer> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  *(undefined1 *)((long)pvVar1 + 0xe0) = 1;
  bVar3 = Input::checkUpdate(inp,true);
  return bVar3;
}

Assistant:

bool ValueFederateManager::getUpdateFromCore(Input& inp)
{
    auto* iData = static_cast<InputData*>(inp.dataReference);
    if (inp.getMultiInputMode() != MultiInputHandlingMethod::NO_OP) {
        const auto& dataV = coreObject->getAllValues(inp.handle);
        iData->hasUpdate = false;
        return inp.vectorDataProcess(dataV);
    }
    const auto& data = coreObject->getValue(inp.handle);
    iData->lastData = data;
    iData->hasUpdate = true;
    return inp.checkUpdate(true);
}